

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::LessThanEqualTest<char,short>(void)

{
  bool bVar1;
  uint7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (int *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar1 = ::operator<=(0,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  uVar2 = false;
  if (bVar1) {
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (int *)(ulong)in_stack_ffffffffffffffd8);
    bVar1 = ::operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,0)
    ;
    uVar2 = false;
    if (bVar1) {
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (int *)(ulong)in_stack_ffffffffffffffd8);
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffe4,7),
                 (int *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
      uVar2 = ::operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                           (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0
                          );
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanEqualTest()
	{
		return
			(U)2 <= SafeInt<T>(3) &&
			SafeInt<T>(4) <= (U)5 &&
			SafeInt<T>(6) <= SafeInt<U>(7);
	}